

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O0

void __thiscall
so_5::timers_details::
actual_manager_t<timertt::timer_heap_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::schedule_anonymous
          (actual_manager_t<timertt::timer_heap_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
           *this,type_index *type_index,mbox_t *mbox,message_ref_t *msg,duration pause,
          duration period)

{
  basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
  *this_00;
  anon_class_32_4_6b32a2d3 local_88;
  timer_action local_68;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  message_ref_t *local_38;
  message_ref_t *msg_local;
  mbox_t *mbox_local;
  type_index *type_index_local;
  actual_manager_t<timertt::timer_heap_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  *this_local;
  duration period_local;
  duration pause_local;
  
  local_38 = msg;
  msg_local = (message_ref_t *)mbox;
  mbox_local = (mbox_t *)type_index;
  type_index_local = (type_index *)this;
  this_local = (actual_manager_t<timertt::timer_heap_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
                *)period.__r;
  period_local = pause;
  this_00 = (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
             *)std::
               unique_ptr<timertt::timer_heap_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_heap_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
               ::operator->(&this->m_manager);
  local_40.__r = period_local.__r;
  local_48.__r = (rep)this_local;
  local_88.type_index._M_target = (type_info *)mbox_local->m_obj;
  local_88.this = this;
  intrusive_ptr_t<so_5::abstract_message_box_t>::intrusive_ptr_t
            (&local_88.mbox,(intrusive_ptr_t<so_5::abstract_message_box_t> *)msg_local);
  intrusive_ptr_t<so_5::message_t>::intrusive_ptr_t(&local_88.msg,local_38);
  std::function<void()>::
  function<so_5::timers_details::actual_manager_t<timertt::timer_heap_manager_template<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>::schedule_anonymous(std::type_index_const&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::intrusive_ptr_t<so_5::message_t>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_,void>
            ((function<void()> *)&local_68,&local_88);
  timertt::details::
  basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::manager>
  ::
  activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (this_00,local_40,local_48,&local_68);
  std::function<void_()>::~function(&local_68);
  actual_manager_t<timertt::timer_heap_manager_template<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
  ::
  schedule_anonymous(std::type_index_const&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::intrusive_ptr_t<so_5::message_t>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>)
  ::{lambda()#1}::~duration((_lambda___1_ *)&local_88);
  return;
}

Assistant:

virtual void
		schedule_anonymous(
			const std::type_index & type_index,
			const mbox_t & mbox,
			const message_ref_t & msg,
			std::chrono::steady_clock::duration pause,
			std::chrono::steady_clock::duration period ) override
			{
				m_manager->activate(
						pause,
						period,
						[this, type_index, mbox, msg]()
						{
							m_collector.get().accept( type_index, mbox, msg );
						} );
			}